

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O2

void __thiscall Boss::Boss(Boss *this,Person *person,Address *address,Employee *employee,Boss *boss)

{
  Address AStack_88;
  
  Address::Address(&AStack_88,address);
  Employee::Employee(&this->super_Employee,person,&AStack_88,employee);
  Address::~Address(&AStack_88);
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_validate_0011ea60;
  this->numberOfEmployee = boss->numberOfEmployee;
  return;
}

Assistant:

Boss::Boss(const Person &person, Address address, const Employee &employee, const Boss &boss) : Employee(person, address, employee) {

    this->numberOfEmployee = boss.numberOfEmployee;
}